

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BooleanStateQueryVerifiers::IsEnabledVerifier::verifyBoolean4
          (IsEnabledVerifier *this,TestContext *testCtx,GLenum name,bool reference0,bool reference1,
          bool reference2,bool reference3)

{
  return;
}

Assistant:

void IsEnabledVerifier::verifyBoolean4 (tcu::TestContext& testCtx, GLenum name, bool reference0, bool reference1, bool reference2, bool reference3)
{
	DE_UNREF(testCtx);
	DE_UNREF(name);
	DE_UNREF(reference0);
	DE_UNREF(reference1);
	DE_UNREF(reference2);
	DE_UNREF(reference3);
	DE_ASSERT(false && "not supported");
}